

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display_settings.c
# Opt level: O1

void al_set_new_display_option(int option,int value,int importance)

{
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *pAVar1;
  byte bVar2;
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *pAVar3;
  ulong uVar4;
  
  pAVar1 = _al_get_new_display_settings();
  bVar2 = (byte)option;
  if (importance == 0) {
    uVar4 = -2L << (bVar2 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar2 & 0x3f);
    pAVar1->required = pAVar1->required & uVar4;
LAB_001571ce:
    pAVar3 = (ALLEGRO_EXTRA_DISPLAY_SETTINGS *)&pAVar1->suggested;
  }
  else {
    if (importance != 2) {
      if (importance != 1) goto LAB_001571d8;
      pAVar1->required = pAVar1->required | 1L << (bVar2 & 0x3f);
      uVar4 = -2L << (bVar2 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar2 & 0x3f);
      goto LAB_001571ce;
    }
    pAVar1->suggested = pAVar1->suggested | 1L << (bVar2 & 0x3f);
    uVar4 = -2L << (bVar2 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar2 & 0x3f);
    pAVar3 = pAVar1;
  }
  pAVar3->required = pAVar3->required & uVar4;
LAB_001571d8:
  pAVar1->settings[option] = value;
  return;
}

Assistant:

void al_set_new_display_option(int option, int value, int importance)
{
   ALLEGRO_EXTRA_DISPLAY_SETTINGS *extras;
   extras = _al_get_new_display_settings();
   switch (importance) {
      case ALLEGRO_REQUIRE:
         extras->required |= (int64_t)1 << option;
         extras->suggested &= ~((int64_t)1 << option);
         break;
      case ALLEGRO_SUGGEST:
         extras->suggested |= (int64_t)1 << option;
         extras->required &= ~((int64_t)1 << option);
         break;
      case ALLEGRO_DONTCARE:
         extras->required &= ~((int64_t)1 << option);
         extras->suggested &= ~((int64_t)1 << option);
         break;
   }
   extras->settings[option] = value;
}